

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O3

void __thiscall Transaction_CommitInt_Test::TestBody(Transaction_CommitInt_Test *this)

{
  element_type *peVar1;
  long lVar2;
  element_type *peVar3;
  internal iVar4;
  unsigned_long uVar5;
  pointer *__ptr;
  char *pcVar6;
  transaction<std::unique_lock<mock_mutex>_> transaction;
  mock_mutex mutex;
  uint64_t g1footer_offset;
  int data_value;
  pair<std::shared_ptr<int>,_pstore::typed_address<int>_> rw;
  database db;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1c8;
  AssertHelper local_1c0;
  undefined1 local_1b8 [8];
  database *local_1b0;
  mutex_type local_179;
  unsigned_long uStack_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_170;
  int local_164;
  undefined1 local_160 [8];
  bool local_158;
  undefined7 uStack_157;
  uint local_150;
  database local_148;
  
  pstore::database::database<pstore::file::in_memory>
            (&local_148,&(this->super_Transaction).store_.file_,true);
  local_148.vacuum_mode_ = disabled;
  peVar1 = (this->super_Transaction).store_.buffer_.
           super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar2 = *(long *)(peVar1 + 0x28);
  local_164 = 0x7fed;
  local_160 = (undefined1  [8])&local_179;
  local_158 = false;
  std::unique_lock<mock_mutex>::lock((unique_lock<mock_mutex> *)local_160);
  local_158 = true;
  pstore::transaction<std::unique_lock<mock_mutex>_>::transaction
            ((transaction<std::unique_lock<mock_mutex>_> *)local_1b8,&local_148,
             (lock_type *)local_160);
  pstore::transaction_base::alloc_rw<int,void>
            ((pair<std::shared_ptr<int>,_pstore::typed_address<int>_> *)local_160,
             (transaction_base *)local_1b8,1);
  local_1c0.data_._0_4_ = 0;
  local_1c8._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       (ulong)(local_150 & 3);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&uStack_178,"0U","rw.second.absolute () % alignof (int)",(uint *)&local_1c0
             ,(unsigned_long *)&local_1c8);
  iVar4 = uStack_178._0_1_;
  if (uStack_178._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1c8._M_head_impl + 0x10),
               "The address must be suitably aligned for int",0x2c);
    if (local_170 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (local_170->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x8e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
    }
    if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_170,local_170);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_157,local_158) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_157,local_158));
    }
  }
  else {
    if (local_170 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_170,local_170);
    }
    *(undefined4 *)local_160 = 0x7fed;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_157,local_158) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT71(uStack_157,local_158));
    }
    pstore::transaction_base::commit((transaction_base *)local_1b8);
  }
  local_1b8 = (undefined1  [8])&PTR__transaction_0026b340;
  pstore::transaction_base::rollback((transaction_base *)local_1b8);
  if (iVar4 == (internal)0x0) goto LAB_001b5032;
  local_160 = (undefined1  [8])0xb8;
  uStack_178 = *(unsigned_long *)(peVar1 + 0x28);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_1b8,"new_header_offset","g1footer_offset",(unsigned_long *)local_160,
             &uStack_178);
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_1c8._M_head_impl + 0x10),"Expected offset of r1 footer to be ",0x23
              );
    std::ostream::_M_insert<unsigned_long>((ulong)(local_1c8._M_head_impl + 0x10));
    if (local_1b0 == (database *)0x0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
               ,0x9e,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
LAB_001b5005:
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if (local_1c8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
    }
  }
  else {
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    local_1c8._M_head_impl._0_4_ = *(undefined4 *)peVar1;
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,4ul>>>>
    ::operator()(local_1b8,(char *)&local_1c8,
                 (array<unsigned_char,_4UL> *)"pstore::header::file_signature1");
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8._M_head_impl + 0x10),"File header was missing",0x17);
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xa3,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    local_1c8._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (peVar1 + 0x28);
    testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
              ((internal *)local_1b8,"g1footer_offset","header->footer_pos.load ().absolute ()",
               &uStack_178,(unsigned_long *)&local_1c8);
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xa5,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    peVar1 = (this->super_Transaction).store_.buffer_.
             super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1c8._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (peVar1 + lVar2);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
    ::operator()(local_1b8,(char *)&local_1c8,
                 (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature1");
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8._M_head_impl + 0x10),"Did not find the r0 footer signature1",
                 0x25);
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xac,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    local_1c8._M_head_impl = local_1c8._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_int>>
              ((internal *)local_1b8,"0U","r0footer->a.generation",(uint *)&local_1c8,
               (atomic<unsigned_int> *)(peVar1 + lVar2 + 8));
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8._M_head_impl + 0x10),"r0 footer generation number must be 0",
                 0x25);
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xae,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    local_1c8._M_head_impl = local_1c8._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_long>>
              ((internal *)local_1b8,"0U","r0footer->a.size",(uint *)&local_1c8,
               (atomic<unsigned_long> *)(peVar1 + lVar2 + 0x10));
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8._M_head_impl + 0x10),
                 "expected the r0 footer size value to be 0",0x29);
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xaf,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    local_1c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    testing::internal::
    CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
              ((internal *)local_1b8,"pstore::typed_address<pstore::trailer>::null ()",
               "r0footer->a.prev_generation",(typed_address<pstore::trailer> *)&local_1c8,
               (typed_address<pstore::trailer> *)(peVar1 + lVar2 + 0x20));
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8._M_head_impl + 0x10),
                 "The r0 footer should not point to a previous generation",0x37);
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xb0,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    local_1c8._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (peVar1 + lVar2 + 0x68);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
    ::operator()(local_1b8,(char *)&local_1c8,
                 (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature2");
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8._M_head_impl + 0x10),"Did not find r0 footer signature2",0x21
                );
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xb3,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    uVar5 = uStack_178;
    peVar3 = (this->super_Transaction).store_.buffer_.
             super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    local_1c8._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (peVar3 + uStack_178);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
    ::operator()(local_1b8,(char *)&local_1c8,
                 (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature1");
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8._M_head_impl + 0x10),"Did not find the r1 footer signature1",
                 0x25);
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xb9,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    local_1c8._M_head_impl._0_4_ = 1;
    testing::internal::CmpHelperEQ<unsigned_int,std::atomic<unsigned_int>>
              ((internal *)local_1b8,"1U","r1footer->a.generation",(uint *)&local_1c8,
               (atomic<unsigned_int> *)(peVar3 + uVar5 + 8));
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8._M_head_impl + 0x10),"r1 footer generation number must be 1",
                 0x25);
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xbb,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    local_1c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4;
    testing::internal::CmpHelperGE<std::atomic<unsigned_long>,unsigned_long>
              ((internal *)local_1b8,"r1footer->a.size","sizeof (int)",
               (atomic<unsigned_long> *)(peVar3 + uVar5 + 0x10),(unsigned_long *)&local_1c8);
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8._M_head_impl + 0x10),
                 "r1 footer size must be at least sizeof (int",0x2b);
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xbc,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    local_1c8._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40;
    testing::internal::
    CmpHelperEQ<pstore::typed_address<pstore::trailer>,pstore::typed_address<pstore::trailer>>
              ((internal *)local_1b8,
               "pstore::typed_address<pstore::trailer>::make (pstore::leader_size)",
               "r1footer->a.prev_generation",(typed_address<pstore::trailer> *)&local_1c8,
               (typed_address<pstore::trailer> *)(peVar3 + uVar5 + 0x20));
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8._M_head_impl + 0x10),
                 "r1 previous pointer must point to r0 footer",0x2b);
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xbe,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    local_1c8._M_head_impl =
         *(basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
          (peVar3 + uVar5 + 0x68);
    testing::internal::
    PredicateFormatterFromMatcher<testing::PolymorphicMatcher<testing::internal::ContainerEqMatcher<std::array<unsigned_char,8ul>>>>
    ::operator()(local_1b8,(char *)&local_1c8,
                 (array<unsigned_char,_8UL> *)"pstore::trailer::default_signature2");
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8._M_head_impl + 0x10),"Did not find r1 footer signature2",0x21
                );
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xc1,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    testing::internal::CmpHelperGE<std::atomic<unsigned_long>,std::atomic<unsigned_long>>
              ((internal *)local_1b8,"r1footer->a.time","r0footer->a.time",
               (atomic<unsigned_long> *)(peVar3 + uVar5 + 0x18),
               (atomic<unsigned_long> *)(peVar1 + lVar2 + 0x18));
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_1c8._M_head_impl + 0x10),
                 "r1 time must not be earlier than r0 time",0x28);
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xc4,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      testing::internal::AssertHelper::~AssertHelper(&local_1c0);
      if (local_1c8._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1c8._M_head_impl + 8))();
      }
    }
    if (local_1b0 != (database *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
    }
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_1b8,"data_value","*r1data",&local_164,
               (int *)((this->super_Transaction).store_.buffer_.
                       super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 0xb0))
    ;
    if (local_1b8[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_1c8);
      if (local_1b0 == (database *)0x0) {
        pcVar6 = "";
      }
      else {
        pcVar6 = ((_Alloc_hider *)&local_1b0->_vptr_database)->_M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_1c0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/unittests/core/test_transaction.cpp"
                 ,0xcb,pcVar6);
      testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
      goto LAB_001b5005;
    }
  }
  if (local_1b0 != (database *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0);
  }
LAB_001b5032:
  pstore::database::~database(&local_148);
  return;
}

Assistant:

TEST_F (Transaction, CommitInt) {
    pstore::database db{store_.file ()};
    db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);

    auto header = this->get_header ();
    std::uint64_t const r0footer_offset = header->footer_pos.load ().absolute ();

    int const data_value = 32749;

    // Scope for the single transaction that we'll commit for the test.
    {
        mock_mutex mutex;
        auto transaction = begin (db, std::unique_lock<mock_mutex>{mutex});
        {
            // Write an integer to the store.
            // If rw is a spanning pointer, it will only be saved to the store when it is deleted.
            // TODO: write a large vector (>4K) so the 'protect' function, which is called by the
            // transaction commit function, has an effect.
            std::pair<std::shared_ptr<int>, pstore::typed_address<int>> rw =
                transaction.alloc_rw<int> ();
            ASSERT_EQ (0U, rw.second.absolute () % alignof (int))
                << "The address must be suitably aligned for int";
            *(rw.first) = data_value;
        }

        transaction.commit ();
    }

    std::uint64_t new_header_offset = pstore::leader_size;
    new_header_offset += sizeof (pstore::trailer);
    new_header_offset += pstore::calc_alignment (new_header_offset, alignof (int));
    std::uint64_t const r1contents_offset = new_header_offset;
    new_header_offset += sizeof (int);
    new_header_offset += pstore::calc_alignment (new_header_offset, alignof (pstore::trailer));

    std::uint64_t const g1footer_offset = header->footer_pos.load ().absolute ();
    ASSERT_EQ (new_header_offset, g1footer_offset)
        << "Expected offset of r1 footer to be " << new_header_offset;


    // Header checks.
    EXPECT_THAT (pstore::header::file_signature1, ::testing::ContainerEq (header->a.signature1))
        << "File header was missing";
    EXPECT_EQ (g1footer_offset, header->footer_pos.load ().absolute ());

    // Check the two footers.
    {
        auto r0footer =
            reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () + r0footer_offset);
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r0footer->a.signature1))
            << "Did not find the r0 footer signature1";
        EXPECT_EQ (0U, r0footer->a.generation) << "r0 footer generation number must be 0";
        EXPECT_EQ (0U, r0footer->a.size) << "expected the r0 footer size value to be 0";
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::null (), r0footer->a.prev_generation)
            << "The r0 footer should not point to a previous generation";
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r0footer->signature2))
            << "Did not find r0 footer signature2";

        auto r1footer =
            reinterpret_cast<pstore::trailer const *> (store_.buffer ().get () + g1footer_offset);
        EXPECT_THAT (pstore::trailer::default_signature1,
                     ::testing::ContainerEq (r1footer->a.signature1))
            << "Did not find the r1 footer signature1";
        EXPECT_EQ (1U, r1footer->a.generation) << "r1 footer generation number must be 1";
        EXPECT_GE (r1footer->a.size, sizeof (int)) << "r1 footer size must be at least sizeof (int";
        EXPECT_EQ (pstore::typed_address<pstore::trailer>::make (pstore::leader_size),
                   r1footer->a.prev_generation)
            << "r1 previous pointer must point to r0 footer";
        EXPECT_THAT (pstore::trailer::default_signature2,
                     ::testing::ContainerEq (r1footer->signature2))
            << "Did not find r1 footer signature2";

        EXPECT_GE (r1footer->a.time, r0footer->a.time)
            << "r1 time must not be earlier than r0 time";
    }

    // Finally check the r1 contents
    {
        auto r1data = reinterpret_cast<int const *> (store_.buffer ().get () + r1contents_offset);
        EXPECT_EQ (data_value, *r1data);
    }
}